

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O1

uint32_t defaultGetFoldedValue(UNewTrie *trie,UChar32 start,int32_t offset)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = start + 0x400;
  while( true ) {
    bVar5 = false;
    if ((trie == (UNewTrie *)0x0) || (0x10ffff < (uint)start)) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      bVar5 = false;
      if (trie->isCompacted == '\0') {
        iVar4 = trie->index[(uint)start >> 5];
        bVar5 = iVar4 != 0;
        iVar1 = -iVar4;
        if (0 < iVar4) {
          iVar1 = iVar4;
        }
        uVar3 = trie->data[(start & 0x1fU) + iVar1];
      }
    }
    iVar4 = 0x20;
    if ((bVar5) && (iVar4 = 1, uVar3 != *trie->data)) break;
    start = start + iVar4;
    if (iVar2 <= start) {
      return 0;
    }
  }
  return offset;
}

Assistant:

static uint32_t U_CALLCONV
defaultGetFoldedValue(UNewTrie *trie, UChar32 start, int32_t offset) {
    uint32_t value, initialValue;
    UChar32 limit;
    UBool inBlockZero;

    initialValue=trie->data[0];
    limit=start+0x400;
    while(start<limit) {
        value=utrie_get32(trie, start, &inBlockZero);
        if(inBlockZero) {
            start+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(value!=initialValue) {
            return (uint32_t)offset;
        } else {
            ++start;
        }
    }
    return 0;
}